

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Int ps_parser_to_coord_array(PS_Parser parser,FT_Int max_coords,FT_Short *coords)

{
  byte *limit;
  byte bVar1;
  ulong uVar2;
  FT_Fixed FVar3;
  uint uVar4;
  FT_Byte *limit_00;
  FT_Int FVar5;
  FT_Byte *cur_1;
  byte *pbVar6;
  FT_Byte *cur;
  byte *local_48;
  uint local_40;
  uint local_3c;
  PS_Parser local_38;
  
  limit_00 = parser->limit;
  skip_spaces(&parser->cursor,limit_00);
  limit = parser->limit;
  local_48 = parser->cursor;
  FVar5 = 0;
  if (local_48 < limit) {
    if (*local_48 == 0x5b) {
      local_40 = 0;
      uVar4 = 0x5d;
    }
    else if (*local_48 == 0x7b) {
      uVar4 = 0x7d;
      local_40 = 0;
    }
    else {
      uVar4 = 0;
      local_40 = (uint)CONCAT71((int7)((ulong)limit_00 >> 8),1);
    }
    if ((char)local_40 == '\0') {
      local_48 = local_48 + 1;
    }
    local_40 = local_40 ^ 1;
    FVar5 = 0;
    local_3c = uVar4;
    local_38 = parser;
    do {
      if (limit <= local_48) break;
      do {
        uVar2 = (ulong)*local_48;
        pbVar6 = local_48;
        if (0x25 < uVar2) break;
        if ((0x100003601U >> (uVar2 & 0x3f) & 1) == 0) {
          if (uVar2 != 0x25) break;
          do {
            pbVar6 = local_48;
            if ((*local_48 == 10) || (*local_48 == 0xd)) break;
            local_48 = local_48 + 1;
            pbVar6 = limit;
          } while (local_48 != limit);
        }
        local_48 = pbVar6 + 1;
        pbVar6 = local_48;
      } while (local_48 < limit);
      local_48 = pbVar6;
      if (pbVar6 < limit) {
        if (uVar4 == *pbVar6) {
          local_48 = pbVar6 + 1;
          goto LAB_00231163;
        }
        if ((coords != (FT_Short *)0x0) && (max_coords <= FVar5)) goto LAB_00231163;
        FVar3 = PS_Conv_ToFixed(&local_48,limit,0);
        if (coords != (FT_Short *)0x0) {
          coords[FVar5] = (FT_Short)((ulong)FVar3 >> 0x10);
        }
        FVar5 = FVar5 + 1;
        if (pbVar6 == local_48) {
          FVar5 = -1;
        }
        bVar1 = pbVar6 != local_48 & (byte)local_40;
        parser = local_38;
        uVar4 = local_3c;
      }
      else {
LAB_00231163:
        bVar1 = 0;
      }
    } while (bVar1 != 0);
  }
  parser->cursor = local_48;
  return FVar5;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  ps_parser_to_coord_array( PS_Parser  parser,
                            FT_Int     max_coords,
                            FT_Short*  coords )
  {
    ps_parser_skip_spaces( parser );
    return ps_tocoordarray( &parser->cursor, parser->limit,
                            max_coords, coords );
  }